

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O2

Node * __thiscall
Lexical::variableDesProgram(Node *__return_storage_ptr__,Lexical *this,int *nowProcedure)

{
  int *to_;
  pointer *ppiVar1;
  int *nowProcedure_00;
  bool bVar2;
  long lVar3;
  int errIndex;
  int errCode;
  allocator local_145;
  int local_144;
  int beginIndex;
  int varIndex;
  Node *local_138;
  int *local_130;
  string local_128;
  Node local_108;
  Node now;
  Node varIdentifier;
  
  Generator::pushIndex(&this->generator);
  beginIndex = this->wordIndex;
  this->wordIndex = (int)((long)beginIndex + 1);
  bVar2 = std::operator!=(&(this->words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)beginIndex + 1].token,"var");
  if (bVar2) {
    errorParsing(__return_storage_ptr__,this,&beginIndex,this->wordIndex,0x17);
  }
  else {
    varIndex = this->wordIndex;
    now.name._M_dataplus._M_p._0_4_ = 2;
    local_108.name._M_dataplus._M_p._0_4_ = 1;
    identifierProgram(&varIdentifier,this,nowProcedure,(int *)&now,(int *)&local_108);
    bVar2 = Node::operator==(&varIdentifier,&nullNode);
    if (bVar2) {
      errorParsing(__return_storage_ptr__,this,&beginIndex,-1,-1);
    }
    else {
      std::__cxx11::string::string((string *)&local_108,"varDescription",(allocator *)&local_144);
      to_ = &this->wordIndex;
      local_128._M_dataplus._M_p._0_4_ = this->nodeCnt;
      this->nodeCnt = (int)local_128._M_dataplus._M_p + 1;
      Node::Node(&now,&local_108.name,(int *)&local_128,&beginIndex,to_);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::string((string *)&local_128,"var",&local_145);
      local_144 = this->nodeCnt;
      this->nodeCnt = local_144 + 1;
      Node::Node(&local_108,&local_128,&local_144,&varIndex,&varIndex);
      local_138 = __return_storage_ptr__;
      local_130 = nowProcedure;
      std::vector<Node,std::allocator<Node>>::emplace_back<Node_const&>
                ((vector<Node,std::allocator<Node>> *)&now.son,&local_108);
      Node::~Node(&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      do {
        lVar3 = (long)this->wordIndex + 1;
        this->wordIndex = (int)lVar3;
        bVar2 = std::operator==(&(this->words).super__Vector_base<Word,_std::allocator<Word>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar3].token,";");
        if (bVar2) {
          now.to = this->wordIndex;
          std::vector<Node,std::allocator<Node>>::emplace_back<Node_const&>
                    ((vector<Node,std::allocator<Node>> *)&now.son,&varIdentifier);
          __return_storage_ptr__ = local_138;
          std::__cxx11::string::string((string *)&local_128,";",&local_145);
          nowProcedure_00 = local_130;
          local_144 = this->nodeCnt;
          this->nodeCnt = local_144 + 1;
          Node::Node(&local_108,&local_128,&local_144,to_,to_);
          std::vector<Node,std::allocator<Node>>::emplace_back<Node_const&>
                    ((vector<Node,std::allocator<Node>> *)&now.son,&local_108);
          Node::~Node(&local_108);
          std::__cxx11::string::~string((string *)&local_128);
          searchVariable(this,&now,nowProcedure_00);
          ppiVar1 = &(this->generator).sizeStack.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppiVar1 = *ppiVar1 + -1;
          Node::Node(__return_storage_ptr__,&now);
          goto LAB_0010693f;
        }
        bVar2 = std::operator==(&(this->words).super__Vector_base<Word,_std::allocator<Word>_>.
                                 _M_impl.super__Vector_impl_data._M_start[this->wordIndex].token,","
                               );
        errIndex = this->wordIndex;
        if (!bVar2) {
          errCode = 0x18;
          goto LAB_0010692a;
        }
        now.to = errIndex;
        std::vector<Node,std::allocator<Node>>::emplace_back<Node_const&>
                  ((vector<Node,std::allocator<Node>> *)&now.son,&varIdentifier);
        std::__cxx11::string::string((string *)&local_128,",",&local_145);
        local_144 = this->nodeCnt;
        this->nodeCnt = local_144 + 1;
        Node::Node(&local_108,&local_128,&local_144,to_,to_);
        std::vector<Node,std::allocator<Node>>::emplace_back<Node_const&>
                  ((vector<Node,std::allocator<Node>> *)&now.son,&local_108);
        Node::~Node(&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        local_128._M_dataplus._M_p._0_4_ = 2;
        local_144 = 1;
        identifierProgram(&local_108,this,local_130,(int *)&local_128,&local_144);
        Node::operator=(&varIdentifier,&local_108);
        Node::~Node(&local_108);
        bVar2 = Node::operator==(&varIdentifier,&nullNode);
      } while (!bVar2);
      errIndex = -1;
      errCode = errIndex;
LAB_0010692a:
      __return_storage_ptr__ = local_138;
      errorParsing(local_138,this,&beginIndex,errIndex,errCode);
LAB_0010693f:
      Node::~Node(&now);
    }
    Node::~Node(&varIdentifier);
  }
  return __return_storage_ptr__;
}

Assistant:

Node variableDesProgram(const int &nowProcedure) {
		generator.pushIndex();
		int beginIndex = wordIndex;

		if (words[++wordIndex].token != "var") return errorParsing(beginIndex, wordIndex, 23);
		int varIndex = wordIndex;

		Node varIdentifier = identifierProgram(nowProcedure, 2);
		if (varIdentifier == nullNode) return errorParsing(beginIndex);

		Node now = Node("varDescription", nodeCnt++, beginIndex, wordIndex);
		now.insertSon(Node("var", nodeCnt++, varIndex, varIndex));
		while (true) {
			wordIndex++;
			if (words[wordIndex].token == ";") {
				now.to = wordIndex;
				now.insertSon(varIdentifier);
				now.insertSon(Node(";", nodeCnt++, wordIndex, wordIndex));
				searchVariable(now, nowProcedure);

				generator.popIndex();
				return now;
			} else if (words[wordIndex].token == ",") {
				now.to = wordIndex;
				now.insertSon(varIdentifier);
				now.insertSon(Node(",", nodeCnt++, wordIndex, wordIndex));

				varIdentifier = identifierProgram(nowProcedure, 2);
				if (varIdentifier == nullNode) return errorParsing(beginIndex);
			} else return errorParsing(beginIndex, wordIndex, 24); // BASE ERROR
		}
	}